

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::XmlReporter(XmlReporter *this,ContextOptions *co)

{
  undefined8 in_RSI;
  ostream *in_RDI;
  XmlWriter *unaff_retaddr;
  ostream *os;
  
  os = in_RDI;
  IReporter::IReporter((IReporter *)in_RDI);
  in_RDI->_vptr_basic_ostream = (_func_int **)&PTR_report_query_00174498;
  XmlWriter::XmlWriter(unaff_retaddr,os);
  std::mutex::mutex((mutex *)0x117d0a);
  *(undefined8 *)&in_RDI->field_0x78 = in_RSI;
  *(undefined8 *)&in_RDI->field_0x80 = 0;
  return;
}

Assistant:

XmlReporter(const ContextOptions& co)
                : xml(*co.cout)
                , opt(co) {}